

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Parameters * __thiscall cnn::Model::add_parameters(Model *this,Dim *d,float scale)

{
  Parameters *this_00;
  Parameters *p;
  Parameters *local_28;
  Parameters *local_20;
  
  this_00 = (Parameters *)operator_new(0xc0);
  Parameters::Parameters(this_00,d,scale);
  local_28 = this_00;
  local_20 = this_00;
  std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
  emplace_back<cnn::ParametersBase*>
            ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,
             (ParametersBase **)&local_28);
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::push_back
            ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)(this + 0x18),
             &local_20);
  return local_20;
}

Assistant:

Parameters* Model::add_parameters(const Dim& d, float scale) {
  Parameters* p = new Parameters(d, scale);
  all_params.push_back(p);
  params.push_back(p);
  return p;
}